

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawShader::Parse(CommandDrawShader *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  CommandDrawShader *this_local;
  
  FScanner::MustGetToken(sc,0x104);
  this->width = sc->Number;
  if (sc->Number < 1) {
    FScanner::ScriptError(sc,"Width must be greater than 1.");
  }
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x104);
  this->height = sc->Number;
  if (sc->Number < 1) {
    FScanner::ScriptError(sc,"Height must be greater than 1.");
  }
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar1 = FScanner::Compare(sc,"vertical");
  if (bVar1) {
    this->vertical = true;
  }
  else {
    bVar1 = FScanner::Compare(sc,"horizontal");
    if (!bVar1) {
      FScanner::ScriptError(sc,"Unknown direction \'%s\'.",sc->String);
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  bVar1 = FScanner::CheckToken(sc,0x101);
  if (bVar1) {
    bVar1 = FScanner::Compare(sc,"reverse");
    if (!bVar1) {
      FScanner::ScriptError(sc,"Exspected \'reverse\', got \'%s\' instead.",sc->String);
    }
    this->reverse = true;
    FScanner::MustGetToken(sc,0x2c);
  }
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  FScanner::MustGetToken(sc,0x3b);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_IntConst);
			width = sc.Number;
			if(sc.Number < 1)
				sc.ScriptError("Width must be greater than 1.");
			sc.MustGetToken(',');
			sc.MustGetToken(TK_IntConst);
			height = sc.Number;
			if(sc.Number < 1)
				sc.ScriptError("Height must be greater than 1.");
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("vertical"))
				vertical = true;
			else if(!sc.Compare("horizontal"))
				sc.ScriptError("Unknown direction '%s'.", sc.String);
			sc.MustGetToken(',');
			if(sc.CheckToken(TK_Identifier))
			{
				if(!sc.Compare("reverse"))
				{
					sc.ScriptError("Exspected 'reverse', got '%s' instead.", sc.String);
				}
				reverse = true;
				sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, x, y);
			sc.MustGetToken(';');
		}